

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O0

void __thiscall
pbrt::FormattingScene::PixelFilter
          (FormattingScene *this,string *name,ParsedParameterVector *params,FileLoc loc)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  ostream *poVar4;
  long in_RDI;
  double dVar5;
  vector<float,_std::allocator<float>_> alpha;
  vector<float,_std::allocator<float>_> yr;
  vector<float,_std::allocator<float>_> xr;
  string extra;
  ParameterDictionary dict;
  string *in_stack_fffffffffffffc48;
  ParameterDictionary *in_stack_fffffffffffffc50;
  undefined4 in_stack_fffffffffffffc58;
  undefined4 in_stack_fffffffffffffc5c;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_stack_fffffffffffffc60;
  float *in_stack_fffffffffffffc68;
  allocator<char> *args_1;
  undefined4 in_stack_fffffffffffffc70;
  int in_stack_fffffffffffffc74;
  FormattingScene *in_stack_fffffffffffffc78;
  ParameterDictionary *in_stack_fffffffffffffc80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc90;
  string local_350 [20];
  int in_stack_fffffffffffffcc4;
  ParameterDictionary *in_stack_fffffffffffffcc8;
  string local_330 [36];
  float local_30c;
  string local_308 [32];
  string local_2e8 [39];
  undefined1 local_2c1 [40];
  allocator<char> local_299;
  string local_298 [32];
  vector<float,_std::allocator<float>_> local_278;
  string local_260 [32];
  string local_240 [39];
  undefined1 local_219 [40];
  undefined1 local_1f1 [33];
  vector<float,_std::allocator<float>_> local_1d0;
  string local_1b8 [32];
  string local_198 [39];
  undefined1 local_171 [40];
  undefined1 local_149 [33];
  vector<float,_std::allocator<float>_> local_128;
  string local_110 [272];
  
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::InlinedVector(in_stack_fffffffffffffc60,
                  (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                   *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
  ParameterDictionary::ParameterDictionary
            (in_stack_fffffffffffffc80,(ParsedParameterVector *)in_stack_fffffffffffffc78,
             (RGBColorSpace *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector(&in_stack_fffffffffffffc50->params);
  std::__cxx11::string::string(local_110);
  if ((*(byte *)(in_RDI + 0x11) & 1) != 0) {
    in_stack_fffffffffffffc90 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_149;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
               (allocator<char> *)in_stack_fffffffffffffc80);
    ParameterDictionary::GetFloatArray
              ((ParameterDictionary *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
               (string *)in_stack_fffffffffffffc50);
    std::__cxx11::string::~string((string *)(local_149 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_149);
    sVar2 = std::vector<float,_std::allocator<float>_>::size(&local_128);
    if (sVar2 == 1) {
      in_stack_fffffffffffffc88 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_171;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
                 (allocator<char> *)in_stack_fffffffffffffc80);
      ParameterDictionary::RemoveFloat(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
      std::__cxx11::string::~string((string *)(local_171 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_171);
      indent_abi_cxx11_(in_stack_fffffffffffffc78,in_stack_fffffffffffffc74);
      std::vector<float,_std::allocator<float>_>::operator[](&local_128,0);
      StringPrintf<std::__cxx11::string,float&>
                ((char *)in_stack_fffffffffffffc78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                 in_stack_fffffffffffffc68);
      std::__cxx11::string::operator+=(local_110,local_198);
      std::__cxx11::string::~string(local_198);
      std::__cxx11::string::~string(local_1b8);
    }
    in_stack_fffffffffffffc80 = (ParameterDictionary *)local_1f1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
               (allocator<char> *)in_stack_fffffffffffffc80);
    ParameterDictionary::GetFloatArray
              ((ParameterDictionary *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
               (string *)in_stack_fffffffffffffc50);
    std::__cxx11::string::~string((string *)(local_1f1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_1f1);
    sVar2 = std::vector<float,_std::allocator<float>_>::size(&local_1d0);
    if (sVar2 == 1) {
      in_stack_fffffffffffffc78 = (FormattingScene *)local_219;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
                 (allocator<char> *)in_stack_fffffffffffffc80);
      ParameterDictionary::RemoveFloat(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
      std::__cxx11::string::~string((string *)(local_219 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_219);
      indent_abi_cxx11_(in_stack_fffffffffffffc78,in_stack_fffffffffffffc74);
      std::vector<float,_std::allocator<float>_>::operator[](&local_1d0,0);
      StringPrintf<std::__cxx11::string,float&>
                ((char *)in_stack_fffffffffffffc78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                 in_stack_fffffffffffffc68);
      std::__cxx11::string::operator+=(local_110,local_240);
      std::__cxx11::string::~string(local_240);
      std::__cxx11::string::~string(local_260);
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffc50,(char *)in_stack_fffffffffffffc48);
    in_stack_fffffffffffffc74 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffc74);
    if (bVar1) {
      args_1 = &local_299;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
                 (allocator<char> *)in_stack_fffffffffffffc80);
      ParameterDictionary::GetFloatArray
                ((ParameterDictionary *)
                 CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                 (string *)in_stack_fffffffffffffc50);
      std::__cxx11::string::~string(local_298);
      std::allocator<char>::~allocator(&local_299);
      sVar2 = std::vector<float,_std::allocator<float>_>::size(&local_278);
      if (sVar2 == 1) {
        in_stack_fffffffffffffc60 =
             (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
              *)local_2c1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
                   (allocator<char> *)in_stack_fffffffffffffc80);
        ParameterDictionary::RemoveFloat(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
        std::__cxx11::string::~string((string *)(local_2c1 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_2c1);
        indent_abi_cxx11_(in_stack_fffffffffffffc78,in_stack_fffffffffffffc74);
        pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](&local_278,0);
        dVar5 = std::sqrt((double)(ulong)(uint)(*pvVar3 + *pvVar3));
        local_30c = 1.0 / SUB84(dVar5,0);
        StringPrintf<std::__cxx11::string,float>
                  ((char *)in_stack_fffffffffffffc78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),(float *)args_1);
        std::__cxx11::string::operator+=(local_110,local_2e8);
        std::__cxx11::string::~string(local_2e8);
        std::__cxx11::string::~string(local_308);
      }
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffc60);
    }
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffc60);
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffc60);
  }
  indent_abi_cxx11_(in_stack_fffffffffffffc78,in_stack_fffffffffffffc74);
  Printf<std::__cxx11::string,std::__cxx11::string_const&>
            ((char *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffc80);
  std::__cxx11::string::~string(local_330);
  poVar4 = std::operator<<((ostream *)&std::cout,local_110);
  ParameterDictionary::ToParameterList_abi_cxx11_
            (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc4);
  std::operator<<(poVar4,local_350);
  std::__cxx11::string::~string(local_350);
  std::__cxx11::string::~string(local_110);
  ParameterDictionary::~ParameterDictionary((ParameterDictionary *)0x67f9c1);
  return;
}

Assistant:

void FormattingScene::PixelFilter(const std::string &name, ParsedParameterVector params,
                                  FileLoc loc) {
    ParameterDictionary dict(std::move(params), RGBColorSpace::sRGB);

    std::string extra;
    if (upgrade) {
        std::vector<Float> xr = dict.GetFloatArray("xwidth");
        if (xr.size() == 1) {
            dict.RemoveFloat("xwidth");
            extra += StringPrintf("%s\"float xradius\" [ %f ]\n", indent(1), xr[0]);
        }
        std::vector<Float> yr = dict.GetFloatArray("ywidth");
        if (yr.size() == 1) {
            dict.RemoveFloat("ywidth");
            extra += StringPrintf("%s\"float yradius\" [ %f ]\n", indent(1), yr[0]);
        }

        if (name == "gaussian") {
            std::vector<Float> alpha = dict.GetFloatArray("alpha");
            if (alpha.size() == 1) {
                dict.RemoveFloat("alpha");
                extra += StringPrintf("%s\"float sigma\" [ %f ]\n", indent(1),
                                      1 / std::sqrt(2 * alpha[0]));
            }
        }
    }

    Printf("%sPixelFilter \"%s\"\n", indent(), name);
    std::cout << extra << dict.ToParameterList(catIndentCount);
}